

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::UpdateDebuggerPropertyInitializationOffset
          (ByteCodeGenerator *this,RegSlot location,PropertyId propertyId,bool shouldConsumeRegister
          )

{
  DebuggerScope *currentDebuggerScope;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  currentDebuggerScope = (this->m_writer).m_currentDebuggerScope;
  if (currentDebuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d7,"(currentDebuggerScope)","currentDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else {
    Js::ByteCodeWriter::UpdateDebuggerPropertyInitializationOffset
              (&this->m_writer,currentDebuggerScope,location,propertyId,shouldConsumeRegister,-1,
               false);
  }
  return;
}

Assistant:

void ByteCodeGenerator::UpdateDebuggerPropertyInitializationOffset(Js::RegSlot location, Js::PropertyId propertyId, bool shouldConsumeRegister)
{
    Assert(this->Writer());
    Js::DebuggerScope* currentDebuggerScope = this->Writer()->GetCurrentDebuggerScope();
    Assert(currentDebuggerScope);
    if (currentDebuggerScope != nullptr)
    {
        this->Writer()->UpdateDebuggerPropertyInitializationOffset(
            currentDebuggerScope,
            location,
            propertyId,
            shouldConsumeRegister);
    }
}